

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  long lVar1;
  ClockingDeclarationSyntax *pCVar2;
  Token *unaff_RBX;
  Token *unaff_R14;
  Token TVar3;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *unaff_retaddr;
  BumpAllocator *in_stack_00000008;
  EventExpressionSyntax *in_stack_00000040;
  Token *in_stack_00000048;
  SyntaxList<slang::syntax::MemberSyntax> *in_stack_00000050;
  Token *in_stack_00000058;
  NamedBlockClauseSyntax **in_stack_00000060;
  BumpAllocator *in_stack_00000078;
  Token *in_stack_00000080;
  BumpAllocator *in_stack_ffffffffffffff28;
  NamedBlockClauseSyntax *in_stack_ffffffffffffff30;
  BumpAllocator *local_30;
  BumpAllocator *alloc;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__child_stack,local_30);
  TVar3 = parsing::Token::deepClone(in_stack_00000080,in_stack_00000078);
  alloc = (BumpAllocator *)TVar3.info;
  parsing::Token::deepClone(in_stack_00000080,in_stack_00000078);
  parsing::Token::deepClone(in_stack_00000080,in_stack_00000078);
  parsing::Token::deepClone(in_stack_00000080,in_stack_00000078);
  not_null<slang::syntax::EventExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::EventExpressionSyntax_*> *)0x58d7dd);
  deepClone<slang::syntax::EventExpressionSyntax>
            ((EventExpressionSyntax *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  parsing::Token::deepClone(in_stack_00000080,in_stack_00000078);
  deepClone<slang::syntax::MemberSyntax>
            ((SyntaxList<slang::syntax::MemberSyntax> *)__child_stack,alloc);
  parsing::Token::deepClone(in_stack_00000080,in_stack_00000078);
  lVar1._0_2_ = ((Token *)((long)__fn + 0xf0))->kind;
  lVar1._2_1_ = ((Token *)((long)__fn + 0xf0))->field_0x2;
  lVar1._3_1_ = ((Token *)((long)__fn + 0xf0))->numFlags;
  lVar1._4_4_ = ((Token *)((long)__fn + 0xf0))->rawLen;
  if (lVar1 != 0) {
    deepClone<slang::syntax::NamedBlockClauseSyntax>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  pCVar2 = BumpAllocator::
           emplace<slang::syntax::ClockingDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::EventExpressionSyntax&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
                     (in_stack_00000008,unaff_retaddr,unaff_R14,unaff_RBX,(Token *)__fn,
                      (Token *)__child_stack,in_stack_00000040,in_stack_00000048,in_stack_00000050,
                      in_stack_00000058,in_stack_00000060);
  return (int)pCVar2;
}

Assistant:

static SyntaxNode* clone(const ClockingDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ClockingDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.globalOrDefault.deepClone(alloc),
        node.clocking.deepClone(alloc),
        node.blockName.deepClone(alloc),
        node.at.deepClone(alloc),
        *deepClone<EventExpressionSyntax>(*node.event, alloc),
        node.semi.deepClone(alloc),
        *deepClone(node.items, alloc),
        node.endClocking.deepClone(alloc),
        node.endBlockName ? deepClone(*node.endBlockName, alloc) : nullptr
    );
}